

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O1

void cfg_schema_add_section(cfg_schema *schema,cfg_schema_section *section)

{
  list_entity *plVar1;
  cfg_schema_entry *pcVar2;
  _Bool _Var3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  _Var3 = cfg_is_allowed_key(section->type);
  if (!_Var3) {
    __assert_fail("cfg_is_allowed_key(section->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_schema.c"
                  ,0x70,
                  "void cfg_schema_add_section(struct cfg_schema *, struct cfg_schema_section *)");
  }
  if (section->def_name != (char *)0x0) {
    pcVar4 = strchr(section->def_name,0x20);
    if (pcVar4 != (char *)0x0) {
      __assert_fail("section->def_name == NULL || cfg_is_allowed_section_name(section->def_name)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_schema.c"
                    ,0x71,
                    "void cfg_schema_add_section(struct cfg_schema *, struct cfg_schema_section *)")
      ;
    }
  }
  (section->_section_node).key = section->type;
  avl_insert(&schema->sections,&section->_section_node);
  if (section->cb_delta_handler != (_func_void *)0x0) {
    plVar1 = (schema->handlers).prev;
    (section->_delta_node).next = &schema->handlers;
    (section->_delta_node).prev = plVar1;
    (schema->handlers).prev = &section->_delta_node;
    plVar1->next = &section->_delta_node;
  }
  if (section->entry_count != 0) {
    lVar6 = 0x40;
    uVar5 = 0;
    do {
      pcVar2 = section->entries;
      _Var3 = cfg_is_allowed_key(*(char **)((long)pcVar2->validate_param + lVar6 + -0x78));
      if (!_Var3) {
        __assert_fail("cfg_is_allowed_key(entry->key.entry)",
                      "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_schema.c"
                      ,0x80,
                      "void cfg_schema_add_section(struct cfg_schema *, struct cfg_schema_section *)"
                     );
      }
      *(cfg_schema_section **)((long)pcVar2 + lVar6 + -8) = section;
      *(char **)((long)pcVar2->validate_param + lVar6 + -0x80) = section->type;
      *(int8_t **)((long)pcVar2 + lVar6 + -0x18) = pcVar2->validate_param[0].i8 + lVar6 + -0x80;
      if ((pcVar2->validate_param[0].i8[lVar6 + -0x58] == '\x01') &&
         (*(long *)((long)pcVar2->validate_param + lVar6 + -0x68) == 1)) {
        *(undefined8 *)((long)pcVar2->validate_param + lVar6 + -0x68) = 0;
      }
      avl_insert(&schema->entries,(avl_node *)((long)section->entries + lVar6 + -0x40));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 200;
    } while (uVar5 < section->entry_count);
  }
  return;
}

Assistant:

void
cfg_schema_add_section(struct cfg_schema *schema, struct cfg_schema_section *section) {
  struct cfg_schema_entry *entry;
  size_t i;

  /* make sure definitions in compiled code are correct */
  assert(cfg_is_allowed_key(section->type));
  assert(section->def_name == NULL || cfg_is_allowed_section_name(section->def_name));

  /* hook section into global section tree */
  section->_section_node.key = section->type;
  avl_insert(&schema->sections, &section->_section_node);

  if (section->cb_delta_handler) {
    /* hook callback into global callback handler list */
    list_add_tail(&schema->handlers, &section->_delta_node);
  }

  for (i = 0; i < section->entry_count; i++) {
    entry = &section->entries[i];

    /* make sure key name in compiled code is correct */
    assert(cfg_is_allowed_key(entry->key.entry));

    entry->_parent = section;
    entry->key.type = section->type;
    entry->_node.key = &entry->key;

    if (entry->list && entry->def.length == 1) {
      /* empty list, set length to zero */
      entry->def.length = 0;
    }

#if 0
    /* make sure all defaults are the same */
    avl_for_each_elements_with_key(&schema->entries, entry_it, _node, entry,
        &section->entries[i].key) {
      if (section->entries[i].def.value == NULL) {
        /* if we have no default, copy the one from the first existing entry */
        memcpy(&section->entries[i].def, &entry->def, sizeof(entry->def));
        break;
      }
      else {
        /* if we have one, overwrite all existing entries */
        memcpy(&entry->def, &section->entries[i].def, sizeof(entry->def));

        // TODO: maybe output some logging that we overwrite the default?
      }
    }
#endif
    avl_insert(&schema->entries, &section->entries[i]._node);
  }
}